

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

optional_idx __thiscall duckdb::StandardBufferManager::GetMaxSwap(StandardBufferManager *this)

{
  mutex *__mutex;
  pointer pTVar1;
  type this_00;
  optional_idx oVar2;
  
  __mutex = &(this->temporary_directory).lock;
  ::std::mutex::lock(__mutex);
  if ((this->temporary_directory).handle.
      super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl ==
      (TemporaryDirectoryHandle *)0x0) {
    oVar2.index = 0xffffffffffffffff;
  }
  else {
    pTVar1 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
             ::operator->(&(this->temporary_directory).handle);
    this_00 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
              ::operator*(&pTVar1->temp_file);
    oVar2 = TemporaryFileManager::GetMaxSwapSpace(this_00);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (optional_idx)oVar2.index;
}

Assistant:

optional_idx StandardBufferManager::GetMaxSwap() const {
	lock_guard<mutex> guard(temporary_directory.lock);
	if (!temporary_directory.handle) {
		return optional_idx();
	}
	return temporary_directory.handle->GetTempFile().GetMaxSwapSpace();
}